

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall crypto_tests::sha256d64::test_method(sha256d64 *this)

{
  long lVar1;
  Span<const_unsigned_char> input;
  Span<unsigned_char> output;
  bool bVar2;
  uint64_t uVar3;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_ffffffffffffee88;
  undefined7 in_stack_ffffffffffffee90;
  undefined1 in_stack_ffffffffffffee97;
  assertion_result *in_stack_ffffffffffffee98;
  undefined4 in_stack_ffffffffffffeea0;
  int in_stack_ffffffffffffeea4;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffeea8;
  const_string *msg;
  lazy_ostream *in_stack_ffffffffffffeeb8;
  const_string *in_stack_ffffffffffffeec0;
  int j_1;
  int j;
  int i;
  sha256d64 *this_local;
  const_string local_1108 [2];
  lazy_ostream local_10e8 [2];
  assertion_result local_10c8;
  const_string local_10b0;
  RandomMixin<FastRandomContext> local_10a0 [3];
  undefined1 local_1070 [8];
  uchar out2 [1024];
  uchar out1 [1024];
  uchar in [2048];
  
  out2[8] = '\0';
  out2[9] = '\0';
  out2[10] = '\0';
  out2[0xb] = '\0';
  out2[0xc] = '\0';
  out2[0xd] = '\0';
  out2[0xe] = '\0';
  out2[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (i = 0; i < 0x21; i = i + 1) {
    for (j = 0; j < i * 0x40; j = j + 1) {
      uVar3 = RandomMixin<FastRandomContext>::randbits
                        (in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea4);
      in[j] = (uchar)uVar3;
    }
    for (j_1 = 0; j_1 < i; j_1 = j_1 + 1) {
      memset(local_1070,0,0x68);
      CHash256::CHash256((CHash256 *)in_stack_ffffffffffffee88);
      Span<const_unsigned_char>::Span<unsigned_char,_0>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffee98,
                 (uchar *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
                 (size_t)in_stack_ffffffffffffee88);
      input.m_data._4_4_ = in_stack_ffffffffffffeea4;
      input.m_data._0_4_ = in_stack_ffffffffffffeea0;
      input.m_size = (size_t)in_stack_ffffffffffffeea8;
      in_stack_ffffffffffffeec0 =
           (const_string *)CHash256::Write((CHash256 *)in_stack_ffffffffffffee98,input);
      Span<unsigned_char>::Span<unsigned_char,_0>
                ((Span<unsigned_char> *)in_stack_ffffffffffffee98,
                 (uchar *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
                 (size_t)in_stack_ffffffffffffee88);
      output.m_data._4_4_ = in_stack_ffffffffffffeea4;
      output.m_data._0_4_ = in_stack_ffffffffffffeea0;
      output.m_size = (size_t)in_stack_ffffffffffffeea8;
      CHash256::Finalize((CHash256 *)in_stack_ffffffffffffee98,output);
    }
    SHA256D64((uchar *)in_stack_ffffffffffffee98,
              (uchar *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
              (size_t)in_stack_ffffffffffffee88);
    do {
      in_stack_ffffffffffffeea0 = (undefined4)boost::unit_test::(anonymous_namespace)::unit_test_log
      ;
      in_stack_ffffffffffffeea4 =
           (int)((ulong)boost::unit_test::(anonymous_namespace)::unit_test_log >> 0x20);
      in_stack_ffffffffffffeea8 = local_10a0;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
                 (pointer)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
                 (unsigned_long)in_stack_ffffffffffffee88);
      msg = &local_10b0;
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee88);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,in_stack_ffffffffffffeec0,(size_t)in_stack_ffffffffffffeeb8
                 ,msg);
      memcmp(out1,out2,(long)(i << 5));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_ffffffffffffee98,(bool)in_stack_ffffffffffffee97);
      in_stack_ffffffffffffeeb8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
                 (pointer)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
                 (unsigned_long)in_stack_ffffffffffffee88);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffee88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffee98,
                 (pointer)CONCAT17(in_stack_ffffffffffffee97,in_stack_ffffffffffffee90),
                 (unsigned_long)in_stack_ffffffffffffee88);
      in_stack_ffffffffffffee88 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_10c8,local_10e8,local_1108,0x43d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_ffffffffffffee88);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffee88);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sha256d64)
{
    for (int i = 0; i <= 32; ++i) {
        unsigned char in[64 * 32];
        unsigned char out1[32 * 32], out2[32 * 32];
        for (int j = 0; j < 64 * i; ++j) {
            in[j] = m_rng.randbits(8);
        }
        for (int j = 0; j < i; ++j) {
            CHash256().Write({in + 64 * j, 64}).Finalize({out1 + 32 * j, 32});
        }
        SHA256D64(out2, in, i);
        BOOST_CHECK(memcmp(out1, out2, 32 * i) == 0);
    }
}